

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O3

ByteData * __thiscall cfd::core::HashUtil::Output(ByteData *__return_storage_ptr__,HashUtil *this)

{
  CfdException *this_00;
  string local_58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  switch(this->hash_type_) {
  case '\x01':
    ByteData::GetBytes(&local_38,&this->buffer_);
    Ripemd160((ByteData160 *)&local_58,&local_38);
    ByteData160::GetData(__return_storage_ptr__,(ByteData160 *)&local_58);
    break;
  case '\x02':
    ByteData::GetBytes(&local_38,&this->buffer_);
    Hash160((ByteData160 *)&local_58,&local_38);
    ByteData160::GetData(__return_storage_ptr__,(ByteData160 *)&local_58);
    break;
  case '\x03':
    ByteData::GetBytes(&local_38,&this->buffer_);
    Sha256((ByteData256 *)&local_58,&local_38);
    ByteData256::GetData(__return_storage_ptr__,(ByteData256 *)&local_58);
    break;
  case '\x04':
    ByteData::GetBytes(&local_38,&this->buffer_);
    Sha256D((ByteData256 *)&local_58,&local_38);
    ByteData256::GetData(__return_storage_ptr__,(ByteData256 *)&local_58);
    break;
  case '\x05':
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58,
                       &this->buffer_);
    Sha512(__return_storage_ptr__,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58
          );
    local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_58._M_dataplus._M_p;
    goto LAB_003004e5;
  default:
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"unknown hash type.","");
    CfdException::CfdException(this_00,kCfdInternalError,&local_58);
    __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (local_58._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_58._M_dataplus._M_p);
  }
LAB_003004e5:
  if (local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData HashUtil::Output() {
  switch (hash_type_) {
    case kRipemd160:
      return Ripemd160(buffer_.GetBytes()).GetData();
    case kHash160:
      return Hash160(buffer_.GetBytes()).GetData();
    case kSha256:
      return Sha256(buffer_.GetBytes()).GetData();
    case kSha256D:
      return Sha256D(buffer_.GetBytes()).GetData();
    case kSha512:
      return Sha512(buffer_.GetBytes());
    default:
      throw CfdException(kCfdInternalError, "unknown hash type.");
  }
}